

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

int nsync::cv_dequeue(void *v,nsync_waiter_s *nw)

{
  uint uVar1;
  int iVar2;
  nsync_dll_list_ pnVar3;
  __atomic_val_t<unsigned_int> local_28;
  uint local_24;
  uint32_t old_word;
  int was_queued;
  nsync_cv *pcv;
  nsync_waiter_s *nw_local;
  void *v_local;
  
  local_28 = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)v,1,1,0);
  uVar1 = std::atomic_load_explicit<unsigned_int>(&nw->waiting,memory_order_acquire);
  if (uVar1 != 0) {
    pnVar3 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 8),&nw->q);
    *(nsync_dll_list_ *)((long)v + 8) = pnVar3;
    std::atomic_store_explicit<unsigned_int>(&nw->waiting,0,memory_order_relaxed);
  }
  local_24 = (uint)(uVar1 != 0);
  iVar2 = nsync_dll_is_empty_(*(nsync_dll_list_ *)((long)v + 8));
  if (iVar2 != 0) {
    local_28 = local_28 & 0xfffffffd;
  }
  std::atomic_store_explicit<unsigned_int>((atomic<unsigned_int> *)v,local_28,memory_order_release);
  return local_24;
}

Assistant:

static int cv_dequeue (void *v, struct nsync_waiter_s *nw) {
	nsync_cv *pcv = (nsync_cv *) v;
	int was_queued = 0;
	/* acquire spinlock */
	uint32_t old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
	if (ATM_LOAD_ACQ (&nw->waiting) != 0) {
		pcv->waiters = nsync_dll_remove_ (pcv->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
		was_queued = 1;
	}
	if (nsync_dll_is_empty_ (pcv->waiters)) {
		old_word &= ~(CV_NON_EMPTY);
	}
	/* Release spinlock. */
	ATM_STORE_REL (&pcv->word, old_word); /* release store */
	return (was_queued);
}